

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_e668::PacketQueue<14680064UL>::sendTo
          (PacketQueue<14680064UL> *this,AVCodecContext *codecctx)

{
  _Elt_pointer pAVar1;
  int iVar2;
  ostream *poVar3;
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->mMutex);
  while (pAVar1 = (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur,
        (this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == pAVar1) {
    if (this->mFinished != false) goto LAB_00109a98;
    std::condition_variable::wait((unique_lock *)&this->mCondVar);
  }
  if (pAVar1 == (_Elt_pointer)0x0) {
LAB_00109a98:
    iVar2 = avcodec_send_packet(codecctx,0);
  }
  else {
    iVar2 = avcodec_send_packet(codecctx);
    if (iVar2 == -0xb) {
      iVar2 = -0xb;
    }
    else {
      if (iVar2 < 0) {
        poVar3 = std::operator<<((ostream *)&std::cerr,"Failed to send packet: ");
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,iVar2);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      this->mTotalSize =
           this->mTotalSize -
           (ulong)(uint)((this->mPackets).super__Deque_base<AVPacket,_std::allocator<AVPacket>_>.
                         _M_impl.super__Deque_impl_data._M_start._M_cur)->size;
      av_packet_unref();
      std::deque<AVPacket,_std::allocator<AVPacket>_>::pop_front(&this->mPackets);
    }
  }
  std::unique_lock<std::mutex>::~unique_lock(&lock);
  return iVar2;
}

Assistant:

int sendTo(AVCodecContext *codecctx)
    {
        std::unique_lock<std::mutex> lock{mMutex};

        AVPacket *pkt{getPacket(lock)};
        if(!pkt) return avcodec_send_packet(codecctx, nullptr);

        const int ret{avcodec_send_packet(codecctx, pkt)};
        if(ret != AVERROR(EAGAIN))
        {
            if(ret < 0)
                std::cerr<< "Failed to send packet: "<<ret <<std::endl;
            pop();
        }
        return ret;
    }